

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

bool __thiscall
duckdb_re2::Regexp::RequiredPrefixForAccel(Regexp *this,string *prefix,bool *foldcase)

{
  byte bVar1;
  int nrunes;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar2;
  anon_union_16_7_f91e83de_for_arguments *runes;
  bool bVar3;
  
  prefix->_M_string_length = 0;
  *(prefix->_M_dataplus)._M_p = '\0';
  *foldcase = false;
  if (this->nsub_ == 0 || this->op_ != '\x05') goto LAB_01ec1919;
  bVar3 = this->nsub_ < 2;
  do {
    paVar2 = &this->field_5;
    if (!bVar3) {
      paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    this = paVar2->subone_;
LAB_01ec1919:
    do {
      bVar1 = this->op_;
      if (bVar1 != 0xb) {
        if (bVar1 - 3 < 2) {
          if (bVar1 == 3) {
            runes = &this->arguments;
            nrunes = 1;
          }
          else {
            runes = (anon_union_16_7_f91e83de_for_arguments *)
                    (this->arguments).literal_string.runes_;
            nrunes = (this->arguments).repeat.max_;
          }
          ConvertRunesToBytes(SUB41((this->parse_flags_ & 0x20) >> 5,0),&runes->rune_,nrunes,prefix)
          ;
          *foldcase = (bool)((byte)this->parse_flags_ & 1);
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
        return bVar3;
      }
      if (this->nsub_ < 2) {
        paVar2 = &this->field_5;
      }
      else {
        paVar2 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
      }
      this = paVar2->subone_;
    } while ((this->op_ != '\x05') || (this->nsub_ == 0));
    bVar3 = this->nsub_ == 1;
  } while( true );
}

Assistant:

bool Regexp::RequiredPrefixForAccel(std::string* prefix, bool* foldcase) {
  prefix->clear();
  *foldcase = false;

  // No need for a walker: the regexp must either begin with or be
  // a literal char or string. We "see through" capturing groups,
  // but make no effort to glue multiple prefix fragments together.
  Regexp* re = op_ == kRegexpConcat && nsub_ > 0 ? sub()[0] : this;
  while (re->op_ == kRegexpCapture) {
    re = re->sub()[0];
    if (re->op_ == kRegexpConcat && re->nsub_ > 0)
      re = re->sub()[0];
  }
  if (re->op_ != kRegexpLiteral &&
      re->op_ != kRegexpLiteralString)
    return false;

  bool latin1 = (re->parse_flags() & Latin1) != 0;
  Rune* runes = re->op_ == kRegexpLiteral ? &re->arguments.rune_ : re->arguments.literal_string.runes_;
  int nrunes = re->op_ == kRegexpLiteral ? 1 : re->arguments.literal_string.nrunes_;
  ConvertRunesToBytes(latin1, runes, nrunes, prefix);
  *foldcase = (re->parse_flags() & FoldCase) != 0;
  return true;
}